

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::ObjectVariablesWalker::GetObjectAddress(ObjectVariablesWalker *this,int index)

{
  PropertyId _propId;
  Var _parentObj;
  Var _value;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Type *ppDVar5;
  undefined4 extraout_var;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  RecyclableObjectAddress *this_00;
  TrackAllocData local_48;
  Type local_20;
  DebuggerPropertyDisplayInfo *info;
  ObjectVariablesWalker *pOStack_10;
  int index_local;
  ObjectVariablesWalker *this_local;
  
  info._4_4_ = index;
  pOStack_10 = this;
  iVar3 = JsUtil::
          ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>::
          Count(&((this->super_VariableWalkerBase).pMembersList)->
                 super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               );
  if (iVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x370,"(index < pMembersList->Count())",
                                "index < pMembersList->Count()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppDVar5 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((this->super_VariableWalkerBase).pMembersList,info._4_4_);
  local_20 = *ppDVar5;
  iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&RecyclableObjectAddress::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0x373);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                     CONCAT44(extraout_var,iVar3),&local_48);
  this_00 = (RecyclableObjectAddress *)
            new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)alloc,0x3f67b0);
  _parentObj = (this->super_VariableWalkerBase).instance;
  _propId = local_20->propId;
  _value = local_20->aVar;
  bVar2 = DebuggerPropertyDisplayInfo::IsInDeadZone(local_20);
  RecyclableObjectAddress::RecyclableObjectAddress(this_00,_parentObj,_propId,_value,(uint)bVar2);
  return &this_00->super_IDiagObjectAddress;
}

Assistant:

IDiagObjectAddress * ObjectVariablesWalker::GetObjectAddress(int index)
    {
        Assert(index < pMembersList->Count());

        DebuggerPropertyDisplayInfo* info = pMembersList->Item(index);
        return Anew(pFrame->GetArena(), RecyclableObjectAddress, instance, info->propId, info->aVar, info->IsInDeadZone() ? TRUE : FALSE);
    }